

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O0

void Imath_3_2::packed2rgb<unsigned_char>(PackedColor packed,Vec3<unsigned_char> *out)

{
  byte bVar1;
  char *in_RSI;
  undefined4 in_EDI;
  uchar f;
  
  bVar1 = std::numeric_limits<unsigned_char>::max();
  bVar1 = bVar1 / 0xff;
  *in_RSI = (char)in_EDI * bVar1;
  in_RSI[1] = (char)((uint)in_EDI >> 8) * bVar1;
  in_RSI[2] = (char)((uint)in_EDI >> 0x10) * bVar1;
  return;
}

Assistant:

IMATH_HOSTDEVICE void
packed2rgb (PackedColor packed, Vec3<T>& out) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        T f   = std::numeric_limits<T>::max () / ((PackedColor) 0xFF);
        out.x = (packed & 0xFF) * f;
        out.y = ((packed & 0xFF00) >> 8) * f;
        out.z = ((packed & 0xFF0000) >> 16) * f;
    }
    else
    {
        T f   = T (1) / T (255);
        out.x = (packed & 0xFF) * f;
        out.y = ((packed & 0xFF00) >> 8) * f;
        out.z = ((packed & 0xFF0000) >> 16) * f;
    }
}